

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall cmGeneratorTarget::CheckCxxModuleStatus(cmGeneratorTarget *this,string *config)

{
  cmMakefile *pcVar1;
  bool bVar2;
  uint uVar3;
  Cxx20SupportLevel CVar4;
  cmGlobalGenerator *pcVar5;
  string *psVar6;
  ulong uVar7;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> _Var8;
  basic_string_view<char,_std::char_traits<char>_> __y;
  string local_1f8;
  char local_1d1;
  string local_1d0;
  char local_1a9;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  undefined1 local_160 [8];
  string effStandard;
  cmStandardLevelResolver standardResolver;
  char local_111;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  undefined4 local_cc;
  basic_string_view<char,_std::char_traits<char>_> local_c8;
  basic_string_view<char,_std::char_traits<char>_> local_b8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_a8;
  string local_88;
  string *local_68;
  string *lang;
  cmSourceFile *sf;
  BT<cmSourceFile_*> *source;
  iterator __end2;
  iterator __begin2;
  vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_> *__range2;
  vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_> sources;
  bool haveScannableSources;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  sources.super__Vector_base<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  bVar2 = HaveCxx20ModuleSources(this,(string *)0x0);
  if (bVar2) {
    sources.super__Vector_base<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  }
  if ((sources.super__Vector_base<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    GetSourceFiles((vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_> *)&__range2,
                   this,config);
    __end2 = std::vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>::begin
                       ((vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_> *)
                        &__range2);
    source = (BT<cmSourceFile_*> *)
             std::vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>::end
                       ((vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_> *)
                        &__range2);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<BT<cmSourceFile_*>_*,_std::vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>_>
                                  *)&source);
      if (!bVar2) break;
      sf = (cmSourceFile *)
           __gnu_cxx::
           __normal_iterator<BT<cmSourceFile_*>_*,_std::vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>_>
           ::operator*(&__end2);
      lang = (string *)(sf->Location).Makefile;
      cmSourceFile::GetLanguage_abi_cxx11_(&local_88,(cmSourceFile *)lang);
      local_68 = &local_88;
      _Var8 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_68);
      local_a8 = _Var8;
      __y = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("CXX",3);
      local_c8 = __y;
      local_b8 = __y;
      bVar2 = std::operator!=(local_a8,__y);
      if (bVar2) {
        local_cc = 3;
      }
      else {
        bVar2 = NeedDyndepForSource(this,local_68,config,(cmSourceFile *)lang);
        if (bVar2) {
          sources.super__Vector_base<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
        }
        local_cc = 0;
      }
      std::__cxx11::string::~string((string *)&local_88);
      __gnu_cxx::
      __normal_iterator<BT<cmSourceFile_*>_*,_std::vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>_>
      ::operator++(&__end2);
    }
    std::vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>::~vector
              ((vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_> *)&__range2);
  }
  if ((sources.super__Vector_base<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
    pcVar5 = GetGlobalGenerator(this);
    uVar3 = (*pcVar5->_vptr_cmGlobalGenerator[0xe])(pcVar5,0);
    if ((uVar3 & 1) == 0) {
      pcVar1 = this->Makefile;
      psVar6 = GetName_abi_cxx11_(this);
      pcVar5 = GetGlobalGenerator(this);
      (*pcVar5->_vptr_cmGlobalGenerator[3])();
      local_111 = '\n';
      cmStrCat<char_const(&)[19],std::__cxx11::string_const&,char_const(&)[92],std::__cxx11::string,char,char_const(&)[234]>
                (&local_f0,(char (*) [19])"The target named \"",psVar6,
                 (char (*) [92])
                 "\" has C++ sources that may use modules, but modules are not supported by this generator:\n  "
                 ,&local_110,&local_111,
                 (char (*) [234])
                 "Modules are supported only by Ninja, Ninja Multi-Config, and Visual Studio generators for VS 17.4 and newer.  See the cmake-cxxmodules(7) manual for details.  Use the CMAKE_CXX_SCAN_FOR_MODULES variable to enable or disable scanning."
                );
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
    }
    else {
      CVar4 = HaveCxxModuleSupport(this,config);
      switch(CVar4) {
      case MissingCxx:
        pcVar1 = this->Makefile;
        psVar6 = GetName_abi_cxx11_(this);
        cmStrCat<char_const(&)[19],std::__cxx11::string_const&,char_const(&)[81]>
                  ((string *)&standardResolver,(char (*) [19])"The target named \"",psVar6,
                   (char (*) [81])
                   "\" has C++ sources that use modules, but the \"CXX\" language has not been enabled."
                  );
        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&standardResolver);
        std::__cxx11::string::~string((string *)&standardResolver);
        break;
      case NoCxx20:
        cmStandardLevelResolver::cmStandardLevelResolver
                  ((cmStandardLevelResolver *)((long)&effStandard.field_2 + 8),this->Makefile);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"CXX",&local_181);
        cmStandardLevelResolver::GetEffectiveStandard
                  ((string *)local_160,(cmStandardLevelResolver *)((long)&effStandard.field_2 + 8),
                   this,&local_180,config);
        std::__cxx11::string::~string((string *)&local_180);
        std::allocator<char>::~allocator(&local_181);
        uVar7 = std::__cxx11::string::empty();
        if ((uVar7 & 1) == 0) {
          local_1a9 = '\"';
          cmStrCat<char_const(&)[18],std::__cxx11::string&,char>
                    (&local_1a8,(char (*) [18])"; found \"cxx_std_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160,
                     &local_1a9);
          std::__cxx11::string::operator=((string *)local_160,(string *)&local_1a8);
          std::__cxx11::string::~string((string *)&local_1a8);
        }
        else {
          std::__cxx11::string::operator=((string *)local_160,"; no C++ standard found");
        }
        pcVar1 = this->Makefile;
        psVar6 = GetName_abi_cxx11_(this);
        local_1d1 = '.';
        cmStrCat<char_const(&)[19],std::__cxx11::string_const&,char_const(&)[117],std::__cxx11::string&,char>
                  (&local_1d0,(char (*) [19])"The target named \"",psVar6,
                   (char (*) [117])
                   "\" has C++ sources that use modules, but does not include \"cxx_std_20\" (or newer) among its `target_compile_features`"
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160,
                   &local_1d1);
        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1d0);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)local_160);
        break;
      case MissingRule:
        pcVar1 = this->Makefile;
        psVar6 = GetName_abi_cxx11_(this);
        cmStrCat<char_const(&)[19],std::__cxx11::string_const&,char_const(&)[248]>
                  (&local_1f8,(char (*) [19])"The target named \"",psVar6,
                   (char (*) [248])
                   "\" has C++ sources that may use modules, but the compiler does not provide a way to discover the import graph dependencies.  See the cmake-cxxmodules(7) manual for details.  Use the CMAKE_CXX_SCAN_FOR_MODULES variable to enable or disable scanning."
                  );
        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1f8);
        std::__cxx11::string::~string((string *)&local_1f8);
        break;
      case Supported:
      }
    }
  }
  return;
}

Assistant:

void cmGeneratorTarget::CheckCxxModuleStatus(std::string const& config) const
{
  bool haveScannableSources = false;

  // Check for `CXX_MODULE*` file sets and a lack of support.
  if (this->HaveCxx20ModuleSources()) {
    haveScannableSources = true;
  }

  if (!haveScannableSources) {
    // Check to see if there are regular sources that have requested scanning.
    auto sources = this->GetSourceFiles(config);
    for (auto const& source : sources) {
      auto const* sf = source.Value;
      auto const& lang = sf->GetLanguage();
      if (lang != "CXX"_s) {
        continue;
      }
      // Ignore sources which do not need dyndep.
      if (this->NeedDyndepForSource(lang, config, sf)) {
        haveScannableSources = true;
      }
    }
  }

  // If there isn't anything scannable, ignore it.
  if (!haveScannableSources) {
    return;
  }

  // If the generator doesn't support modules at all, error that we have
  // sources that require the support.
  if (!this->GetGlobalGenerator()->CheckCxxModuleSupport(
        cmGlobalGenerator::CxxModuleSupportQuery::Expected)) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("The target named \"", this->GetName(),
               "\" has C++ sources that may use modules, but modules are not "
               "supported by this generator:\n  ",
               this->GetGlobalGenerator()->GetName(), '\n',
               "Modules are supported only by Ninja, Ninja Multi-Config, "
               "and Visual Studio generators for VS 17.4 and newer.  "
               "See the cmake-cxxmodules(7) manual for details.  "
               "Use the CMAKE_CXX_SCAN_FOR_MODULES variable to enable or "
               "disable scanning."));
    return;
  }

  switch (this->HaveCxxModuleSupport(config)) {
    case cmGeneratorTarget::Cxx20SupportLevel::MissingCxx:
      this->Makefile->IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat("The target named \"", this->GetName(),
                 "\" has C++ sources that use modules, but the \"CXX\" "
                 "language has not been enabled."));
      break;
    case cmGeneratorTarget::Cxx20SupportLevel::NoCxx20: {
      cmStandardLevelResolver standardResolver(this->Makefile);
      auto effStandard =
        standardResolver.GetEffectiveStandard(this, "CXX", config);
      if (effStandard.empty()) {
        effStandard = "; no C++ standard found";
      } else {
        effStandard = cmStrCat("; found \"cxx_std_", effStandard, '"');
      }
      this->Makefile->IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat(
          "The target named \"", this->GetName(),
          "\" has C++ sources that use modules, but does not include "
          "\"cxx_std_20\" (or newer) among its `target_compile_features`",
          effStandard, '.'));
    } break;
    case cmGeneratorTarget::Cxx20SupportLevel::MissingRule: {
      this->Makefile->IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat("The target named \"", this->GetName(),
                 "\" has C++ sources that may use modules, but the compiler "
                 "does not provide a way to discover the import graph "
                 "dependencies.  See the cmake-cxxmodules(7) manual for "
                 "details.  Use the CMAKE_CXX_SCAN_FOR_MODULES variable to "
                 "enable or disable scanning."));
    } break;
    case cmGeneratorTarget::Cxx20SupportLevel::Supported:
      // All is well.
      break;
  }
}